

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::SourceLocationTable::FindImport
          (SourceLocationTable *this,Message *descriptor,string *name,int *line,int *column)

{
  second_type *psVar1;
  pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  pair<int,_int> *result;
  int *column_local;
  int *line_local;
  string *name_local;
  Message *descriptor_local;
  SourceLocationTable *this_local;
  
  result = (pair<int,_int> *)column;
  column_local = line;
  line_local = (int *)name;
  name_local = (string *)descriptor;
  descriptor_local = (Message *)this;
  std::make_pair<google::protobuf::Message_const*&,std::__cxx11::string_const&>
            (&local_68,(Message **)&name_local,name);
  psVar1 = FindOrNull<std::map<std::pair<google::protobuf::Message_const*,std::__cxx11::string>,std::pair<int,int>,std::less<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::allocator<std::pair<std::pair<google::protobuf::Message_const*,std::__cxx11::string>const,std::pair<int,int>>>>>
                     (&this->import_location_map_,&local_68);
  std::
  pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_68);
  if (psVar1 != (second_type *)0x0) {
    *column_local = psVar1->first;
    result->first = psVar1->second;
  }
  else {
    *column_local = -1;
    result->first = 0;
  }
  return psVar1 != (second_type *)0x0;
}

Assistant:

bool SourceLocationTable::FindImport(const Message* descriptor,
                                     const std::string& name, int* line,
                                     int* column) const {
  const std::pair<int, int>* result =
      FindOrNull(import_location_map_, std::make_pair(descriptor, name));
  if (result == nullptr) {
    *line = -1;
    *column = 0;
    return false;
  } else {
    *line = result->first;
    *column = result->second;
    return true;
  }
}